

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

char * lws_sql_purify(char *escaped,char *string,size_t len)

{
  char cVar1;
  char *p;
  char *pcVar2;
  char *q;
  char *pcVar3;
  char *pcVar4;
  
  cVar1 = *string;
  pcVar4 = escaped;
  if (cVar1 != '\0') {
    pcVar2 = string + 1;
    pcVar3 = escaped;
    do {
      pcVar4 = pcVar3;
      if (len < 3) break;
      if (cVar1 == '\'') {
        pcVar4 = pcVar3 + 2;
        pcVar3[1] = '\'';
        len = len - 2;
      }
      else {
        len = len - 1;
        pcVar4 = pcVar3 + 1;
      }
      *pcVar3 = cVar1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
      pcVar3 = pcVar4;
    } while (cVar1 != '\0');
  }
  *pcVar4 = '\0';
  return escaped;
}

Assistant:

const char *
lws_sql_purify(char *escaped, const char *string, size_t len)
{
	const char *p = string;
	char *q = escaped;

	while (*p && len-- > 2) {
		if (*p == '\'') {
			*q++ = '\'';
			*q++ = '\'';
			len --;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	return escaped;
}